

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jp2.c
# Opt level: O3

opj_bool jp2_read_jp_v2(opj_jp2_v2_t *jp2,uchar *p_header_data,uint p_header_size,
                       opj_event_mgr_t *p_manager)

{
  undefined8 in_RAX;
  char *fmt;
  uint l_magic_number;
  OPJ_UINT32 local_24;
  
  local_24 = (OPJ_UINT32)((ulong)in_RAX >> 0x20);
  if (jp2->jp2_state == 0) {
    if (p_header_size == 4) {
      opj_read_bytes_LE(p_header_data,&local_24,4);
      if (local_24 == 0xd0a870a) {
        *(byte *)&jp2->jp2_state = (byte)jp2->jp2_state | 1;
        return 1;
      }
      fmt = "Error with JP Signature : bad magic number\n";
    }
    else {
      fmt = "Error with JP signature Box size\n";
    }
  }
  else {
    fmt = "The signature box must be the first box in the file.\n";
  }
  opj_event_msg_v2(p_manager,1,fmt);
  return 0;
}

Assistant:

opj_bool jp2_read_jp_v2(
					opj_jp2_v2_t *jp2,
					unsigned char * p_header_data,
					unsigned int p_header_size,
					opj_event_mgr_t * p_manager
				 )
{
	unsigned int l_magic_number;

	/* preconditions */
	assert(p_header_data != 00);
	assert(jp2 != 00);
	assert(p_manager != 00);

	if (jp2->jp2_state != JP2_STATE_NONE) {
		opj_event_msg_v2(p_manager, EVT_ERROR, "The signature box must be the first box in the file.\n");
		return OPJ_FALSE;
	}

	/* assure length of data is correct (4 -> magic number) */
	if (p_header_size != 4) {
		opj_event_msg_v2(p_manager, EVT_ERROR, "Error with JP signature Box size\n");
		return OPJ_FALSE;
	}

	/* rearrange data */
	opj_read_bytes(p_header_data,&l_magic_number,4);
	if (l_magic_number != 0x0d0a870a ) {
		opj_event_msg_v2(p_manager, EVT_ERROR, "Error with JP Signature : bad magic number\n");
		return OPJ_FALSE;
	}

	jp2->jp2_state |= JP2_STATE_SIGNATURE;

	return OPJ_TRUE;
}